

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Facet.hpp
# Opt level: O1

bool planeBoxOverlap(Point<double> *normal,Point<double> *vert,Point<double> *maxbox)

{
  double dVar1;
  double dVar2;
  int q;
  long lVar3;
  double dVar4;
  Point<double> vmin;
  Point<double> vmax;
  
  lVar3 = 0;
  do {
    dVar1 = (vert->pos)._M_elems[lVar3];
    dVar4 = (maxbox->pos)._M_elems[lVar3];
    if ((normal->pos)._M_elems[lVar3] <= 0.0) {
      vmin.pos._M_elems[lVar3] = dVar4 - dVar1;
      dVar4 = -dVar4;
    }
    else {
      vmin.pos._M_elems[lVar3] = -dVar4 - dVar1;
    }
    vmax.pos._M_elems[lVar3] = dVar4 - dVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  dVar1 = (normal->pos)._M_elems[0];
  dVar4 = (normal->pos)._M_elems[1];
  dVar2 = (normal->pos)._M_elems[2];
  if (0.0 < vmin.pos._M_elems[2] * dVar2 +
            vmin.pos._M_elems[0] * dVar1 + vmin.pos._M_elems[1] * dVar4 + -1e-10) {
    return false;
  }
  return 0.0 <= dVar2 * vmax.pos._M_elems[2] +
                dVar1 * vmax.pos._M_elems[0] + dVar4 * vmax.pos._M_elems[1] + 1e-10;
}

Assistant:

inline bool planeBoxOverlap(const Parfait::Point<double> &normal, const Parfait::Point<double> &vert,
                     const Parfait::Point<double> &maxbox) {
    Parfait::Point<double> vmin, vmax;
    for (int q = 0; q < 3; q++) {
        double v = vert[q];
        if (normal[q] > 0.0) { vmin[q] = -maxbox[q] - v;
            vmax[q] = maxbox[q] - v;
        } else {
            vmin[q] = maxbox[q] - v;
            vmax[q] = -maxbox[q] - v;
        }
    }
    if (Parfait::Point<double>::dot(normal, vmin) - TOL > 0.0) {
        return false;
    }
    if (Parfait::Point<double>::dot(normal, vmax) + TOL >= 0.0) {
        return true;
    }

    return false;
}